

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pageant.c
# Opt level: O2

void fail_requests_for_key(PageantKey *pk,char *reason)

{
  PageantKeyRequestNode *pPVar1;
  PageantKeyRequestNode *pPVar2;
  strbuf *sb;
  
  while (pPVar1 = (pk->blocked_requests).next, pPVar1 != &pk->blocked_requests) {
    signop_unlink((PageantSignOp *)(pPVar1 + -2));
    sb = strbuf_new();
    failure((PageantClient *)(pPVar1[1].next)->prev,(PageantClientRequestId *)pPVar1[3].prev,sb,
            *(uchar *)&pPVar1[-1].next,"%s",reason);
    pPVar2 = (pPVar1[1].next)->prev;
    (*(code *)pPVar2->prev->next)(pPVar2,pPVar1[3].prev,sb->u,sb->len);
    strbuf_free(sb);
    pageant_async_op_unlink_and_free((PageantAsyncOp *)(pPVar1 + 1));
  }
  return;
}

Assistant:

static void fail_requests_for_key(PageantKey *pk, const char *reason)
{
    while (pk->blocked_requests.next != &pk->blocked_requests) {
        PageantSignOp *so = container_of(pk->blocked_requests.next,
                                         PageantSignOp, pkr);
        signop_unlink(so);
        strbuf *sb = strbuf_new();
        failure(so->pao.info->pc, so->pao.reqid, sb, so->failure_type,
                "%s", reason);
        pageant_client_got_response(so->pao.info->pc, so->pao.reqid,
                                    ptrlen_from_strbuf(sb));
        strbuf_free(sb);
        pageant_async_op_unlink_and_free(&so->pao);
    }
}